

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_pooling1x1(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  reference pvVar11;
  long in_RDI;
  int top_blob_index_final;
  Layer *any;
  int k;
  int j;
  int top_i;
  int bottom_blob_index;
  Pooling *pooling;
  int i;
  int layer_count;
  char *in_stack_ffffffffffffff98;
  FILE *in_stack_ffffffffffffffa0;
  int local_28;
  int local_24;
  int local_20;
  int local_10;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_10 = 0;
  do {
    if ((int)sVar5 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar4) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pLVar2 = *ppLVar6;
      if ((((((*(int *)&pLVar2[1].type.field_0x4 == 0) &&
             ((int)pLVar2[1].type._M_string_length == 0)) &&
            (*(int *)((long)&pLVar2[1].type._M_string_length + 4) == 0)) &&
           ((*(int *)&pLVar2[1].type.field_2 == 0 &&
            (*(int *)((long)&pLVar2[1]._vptr_Layer + 4) == 1)))) &&
          ((iVar1._0_1_ = pLVar2[1].one_blob_only, iVar1._1_1_ = pLVar2[1].support_inplace,
           iVar1._2_1_ = pLVar2[1].support_vulkan, iVar1._3_1_ = pLVar2[1].support_packing,
           iVar1 == 1 && ((pLVar2[1].typeindex == 1 && (*(int *)&pLVar2[1].type == 1)))))) &&
         (*(int *)((long)&pLVar2[1].type.field_2 + 4) == 0)) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->bottoms,0);
        iVar1 = *pvVar7;
        local_20 = -1;
        local_24 = local_10;
        do {
          do {
            local_24 = local_24 + -1;
            if (local_24 < 0) goto LAB_001188b5;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_24);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          } while (bVar4);
          local_28 = 0;
          while( true ) {
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x40),(long)local_24);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->tops);
            if (sVar8 <= (ulong)(long)local_28) break;
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x40),(long)local_24);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(*ppLVar6)->tops,(long)local_28);
            if (*pvVar7 == iVar1) {
              local_20 = local_28;
              break;
            }
            local_28 = local_28 + 1;
          }
        } while (local_20 == -1);
LAB_001188b5:
        if (local_24 != -1) {
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_24);
          pLVar3 = *ppLVar6;
          in_stack_ffffffffffffffa0 = _stderr;
          uVar9 = std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf(in_stack_ffffffffffffffa0,"eliminate_pooling1x1 %s %s\n",uVar9,uVar10);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
          iVar1 = *pvVar7;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,(long)local_20);
          *pvVar7 = iVar1;
          pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                               (long)iVar1);
          pvVar11->producer = local_24;
          std::__cxx11::string::operator=((string *)&pLVar2->type,"ncnnfused");
        }
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_pooling1x1()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->pad_left != 0 || pooling->pad_right != 0 || pooling->pad_top != 0 || pooling->pad_bottom != 0)
            continue;

        if (pooling->kernel_w != 1 || pooling->kernel_h != 1 || pooling->stride_w != 1 || pooling->stride_h != 1)
            continue;

        if (pooling->global_pooling != 0)
            continue;

        // Any - Pooling
        int bottom_blob_index = layers[i]->bottoms[0];

        int top_i = -1;
        int j = i - 1;
        for (; j>=0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            for (int k=0; k<layers[j]->tops.size(); k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    top_i = k;
                    break;
                }
            }

            if (top_i != -1)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_pooling1x1 %s %s\n", any->name.c_str(), pooling->name.c_str());

        int top_blob_index_final = pooling->tops[0];
        any->tops[top_i] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        pooling->type = "ncnnfused";
    }

    return 0;
}